

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusVtxAttrFloat::emulate_mthd(MthdCelsiusVtxAttrFloat *this)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar1 = this->which;
    uVar2 = (ulong)uVar1;
    if ((uVar2 < 5) && ((0x1aU >> (uVar1 & 0x1f) & 1) != 0)) {
      iVar3 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
      if ((iVar3 < 1) &&
         ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset != 0x10)) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_xfrm[uVar2 - 7]
        [1] = 0;
        iVar3 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
      }
      if (iVar3 < 2) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_xfrm[uVar2 - 7]
        [2] = 0;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
        [(uVar2 * 4 & 0xffffffff) + 3] = 0x3f800000;
      }
    }
    else {
      iVar3 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
    }
    iVar4 = 0xb;
    if (uVar1 != 7) {
      iVar4 = iVar3 + uVar1 * 4;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[iVar4] =
         (this->super_SingleMthdTest).super_MthdTest.val;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			if (which == 1 || which == 3 || which == 4) {
				if (idx < 1 && chipset.chipset != 0x10)
					exp.celsius_pipe_vtx[which * 4 + 1] = 0;
				if (idx < 2) {
					exp.celsius_pipe_vtx[which * 4 + 2] = 0;
					exp.celsius_pipe_vtx[which * 4 + 3] = 0x3f800000;
				}
			}
			exp.celsius_pipe_vtx[which == 7 ? 11 : which * 4 + idx] = val;
		}
	}